

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::load(Fl_Tree *this,Fl_Preferences *prefs)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *__s_00;
  ulong uVar7;
  char *__format;
  int iVar8;
  int iVar9;
  Fl_Preferences prefsChild;
  
  __s = prefs->node->path_;
  sVar2 = strlen(__s);
  if (*__s == '.') {
    lVar3 = 2 - (ulong)(__s[1] == '\0');
  }
  else {
    lVar3 = 2;
  }
  iVar1 = Fl_Preferences::groups(prefs);
  iVar8 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar8; iVar8 = iVar8 + 1) {
    Fl_Preferences::Fl_Preferences(&prefsChild,prefs,iVar8);
    add(this,(prefsChild.node)->path_ + 2);
    load(this,&prefsChild);
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&prefsChild);
  }
  iVar1 = Fl_Preferences::entries(prefs);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (iVar8 = 0; iVar8 != iVar1; iVar8 = iVar8 + 1) {
    pcVar4 = Fl_Preferences::entry(prefs,iVar8);
    pcVar4 = strdup(pcVar4);
    sVar5 = strlen(pcVar4);
    uVar6 = sVar5 & 0xffffffff;
    if ((int)sVar5 < 1) {
      uVar6 = 0;
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      if (pcVar4[uVar7] == '/') {
        pcVar4[uVar7] = '\\';
      }
    }
    Fl_Preferences::get(prefs,pcVar4,(char **)&prefsChild,"");
    sVar5 = strlen((char *)prefsChild._vptr_Fl_Preferences);
    iVar9 = (int)sVar5;
    uVar6 = 0;
    if (0 < iVar9) {
      uVar6 = sVar5 & 0xffffffff;
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      if (*(char *)((long)prefsChild._vptr_Fl_Preferences + uVar7) == '/') {
        *(undefined1 *)((long)prefsChild._vptr_Fl_Preferences + uVar7) = 0x5c;
      }
    }
    sVar5 = strlen(pcVar4);
    if (iVar9 < 0x28) {
      __s_00 = (char *)malloc((long)iVar9 + (long)(int)sVar2 + 5 + sVar5);
      __format = "%s/%s = %s";
    }
    else {
      __s_00 = (char *)malloc(sVar5 + (long)(int)sVar2 + 0x2d);
      __format = "%s/%s = %.40s...";
    }
    sprintf(__s_00,__format,__s + lVar3,pcVar4,prefsChild._vptr_Fl_Preferences);
    add(this,__s_00 + (*__s_00 == '/'));
    free(__s_00);
    free(prefsChild._vptr_Fl_Preferences);
    free(pcVar4);
  }
  return;
}

Assistant:

void Fl_Tree::load(Fl_Preferences &prefs) {
  int i, j, n, pn = (int) strlen(prefs.path());
  char *p;
  const char *path = prefs.path();
  if (strcmp(path, ".")==0)
    path += 1; // root path is empty
  else
    path += 2; // child path starts with "./"
  n = prefs.groups();
  for (i=0; i<n; i++) {
    Fl_Preferences prefsChild(prefs, i);
    add(prefsChild.path()+2); // children always start with "./"
    load(prefsChild);
  }
  n = prefs.entries();
  for (i=0; i<n; i++) {
    // We must remove all fwd slashes in the key and value strings. Replace with backslash.
    char *key = strdup(prefs.entry(i));
    int kn = (int) strlen(key);
    for (j=0; j<kn; j++) {
      if (key[j]=='/') key[j]='\\'; 
    }
    char *val;  prefs.get(key, val, "");
    int vn = (int) strlen(val);
    for (j=0; j<vn; j++) {
      if (val[j]=='/') val[j]='\\'; 
    }
    if (vn<40) {
      size_t sze = pn + strlen(key) + vn;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %s", path, key, val);
    } else {
      size_t sze = pn + strlen(key) + 40;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %.40s...", path, key, val);
    }
    add(p[0]=='/'?p+1:p);
    free(p);
    free(val);
    free(key);
  }
}